

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::update(Texture *this,Window *window,uint x,uint y)

{
  bool bVar1;
  Vector2u VVar2;
  Uint64 UVar3;
  uint uStack_50;
  uint local_4c;
  TextureSaver local_38;
  TransientContextLock local_31;
  TextureSaver save;
  uint uStack_2c;
  TransientContextLock lock;
  uint local_28;
  uint y_local;
  uint x_local;
  Window *window_local;
  Texture *this_local;
  
  VVar2 = Window::getSize(window);
  local_28 = VVar2.x;
  if ((this->m_size).x < x + local_28) {
    __assert_fail("x + window.getSize().x <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x23c,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
  }
  _save = Window::getSize(window);
  if ((this->m_size).y < y + uStack_2c) {
    __assert_fail("y + window.getSize().y <= m_size.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x23d,"void sf::Texture::update(const Window &, unsigned int, unsigned int)");
  }
  if ((this->m_texture != 0) && (bVar1 = Window::setActive(window,true), bVar1)) {
    GlResource::TransientContextLock::TransientContextLock(&local_31);
    priv::TextureSaver::TextureSaver(&local_38);
    glBindTexture(0xde1,this->m_texture);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x247,"glBindTexture(GL_TEXTURE_2D, m_texture)");
    VVar2 = Window::getSize(window);
    local_4c = VVar2.x;
    VVar2 = Window::getSize(window);
    uStack_50 = VVar2.y;
    glCopyTexSubImage2D(0xde1,0,x,y,0,0,local_4c,uStack_50);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x248,
                       "glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y)"
                      );
    glTexParameteri(0xde1,0x2801,this->m_isSmooth & 1 | 0x2600);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x249,
                       "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                      );
    this->m_hasMipmap = false;
    this->m_pixelsFlipped = true;
    UVar3 = anon_unknown.dwarf_d70e4::getUniqueId();
    this->m_cacheId = UVar3;
    glFlush();
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                       ,0x250,"glFlush()");
    priv::TextureSaver::~TextureSaver(&local_38);
    GlResource::TransientContextLock::~TransientContextLock(&local_31);
  }
  return;
}

Assistant:

void Texture::update(const Window& window, unsigned int x, unsigned int y)
{
    assert(x + window.getSize().x <= m_size.x);
    assert(y + window.getSize().y <= m_size.y);

    if (m_texture && window.setActive(true))
    {
        TransientContextLock lock;

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Copy pixels from the back-buffer to the texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glCopyTexSubImage2D(GL_TEXTURE_2D, 0, x, y, 0, 0, window.getSize().x, window.getSize().y));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = true;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());
    }
}